

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

boolean donning_on(obj *otmp)

{
  obj *otmp_local;
  
  if (otmp == uarm) {
    otmp_local._7_1_ = afternmv == Armor_on;
  }
  else if (otmp == uarmu) {
    otmp_local._7_1_ = afternmv == Shirt_on;
  }
  else if (otmp == uarmc) {
    otmp_local._7_1_ = afternmv == Cloak_on;
  }
  else if (otmp == uarmf) {
    otmp_local._7_1_ = afternmv == Boots_on;
  }
  else if (otmp == uarmh) {
    otmp_local._7_1_ = afternmv == Helmet_on;
  }
  else if (otmp == uarmg) {
    otmp_local._7_1_ = afternmv == Gloves_on;
  }
  else if (otmp == uarms) {
    otmp_local._7_1_ = afternmv == Shield_on;
  }
  else {
    otmp_local._7_1_ = false;
  }
  return otmp_local._7_1_;
}

Assistant:

boolean donning_on(const struct obj *otmp)
{
	/*
	 * Caveat: This returns FALSE if armor that was being put on is
	 *         cancelled with cancel_don() but has not yet been dealt
	 *         with by the corresponding Foo_off().
	 *
	 * cancel_don() unsets afternmv, but the matching uarm* global isn't
	 * unset until its corresponding Foo_off() is called.
	 */
	if (otmp == uarm) return (afternmv == Armor_on);
	if (otmp == uarmu) return (afternmv == Shirt_on);
	if (otmp == uarmc) return (afternmv == Cloak_on);
	if (otmp == uarmf) return (afternmv == Boots_on);
	if (otmp == uarmh) return (afternmv == Helmet_on);
	if (otmp == uarmg) return (afternmv == Gloves_on);
	if (otmp == uarms) return (afternmv == Shield_on);
	return FALSE;
}